

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

void CSOAA::predict_or_learn<false>(csoaa *c,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float fVar2;
  wclass *pwVar3;
  wclass *pwVar4;
  float *pfVar5;
  bool bVar6;
  wclass *pwVar7;
  size_t sVar8;
  uint uVar9;
  uint64_t uVar10;
  polyprediction *ppVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  features *pfVar16;
  uint uVar17;
  wclass *__begin3;
  wclass *pwVar18;
  unsigned_long uVar19;
  feature_index i;
  float fVar20;
  float local_68;
  ulong local_60;
  
  pwVar3 = (ec->l).cs.costs._begin;
  pwVar4 = (ec->l).cs.costs._end;
  pwVar7 = (ec->l).cs.costs.end_array;
  sVar8 = (ec->l).cs.costs.erase_count;
  pfVar16 = ec->passthrough;
  if (pfVar16 == (features *)0x0) {
    lVar15 = 0;
  }
  else {
    lVar15 = (long)(pfVar16->values)._end - (long)(pfVar16->values)._begin >> 2;
  }
  (ec->l).cs.costs._begin = (wclass *)0x0;
  (ec->l).simple.initial = 0.0;
  if (pwVar4 == pwVar3) {
    (ec->l).multi.label = 0x7f7fffff;
    (ec->l).simple.initial = 0.0;
    uVar12 = c->num_classes;
    uVar13 = (ulong)uVar12;
    ppVar11 = c->pred;
    if (*(code **)(base + 0x40) == (code *)0x0) {
      if (uVar13 == 0) {
        uVar10 = (ec->super_example_predict).ft_offset;
      }
      else {
        lVar14 = 0;
        do {
          (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
          *(float *)((long)ppVar11 + lVar14) = ec->partial_prediction;
          uVar10 = (ulong)*(uint *)(base + 0xe0) + (ec->super_example_predict).ft_offset;
          (ec->super_example_predict).ft_offset = uVar10;
          lVar14 = lVar14 + 0x20;
        } while (uVar13 << 5 != lVar14);
      }
      uVar10 = uVar10 - uVar12 * *(int *)(base + 0xe0);
    }
    else {
      (**(code **)(base + 0x40))
                (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,uVar13,
                 *(undefined8 *)(base + 0xe0),ppVar11,0);
      uVar10 = (ec->super_example_predict).ft_offset;
    }
    (ec->super_example_predict).ft_offset = uVar10;
    uVar12 = c->num_classes;
    ppVar11 = c->pred;
    if (uVar12 == 0) {
      local_60._0_4_ = 1;
    }
    else {
      uVar17 = 1;
      local_60._0_4_ = 1;
      do {
        if (ec->passthrough != (features *)0x0) {
          features::push_back(ec->passthrough,ppVar11[uVar17 - 1].scalar,
                              (ulong)uVar17 ^ 0x398d9fda640553);
          ppVar11 = c->pred;
          uVar12 = c->num_classes;
        }
        uVar9 = uVar17;
        if (ppVar11[(uint32_t)local_60 - 1].scalar < ppVar11[uVar17 - 1].scalar ||
            ppVar11[(uint32_t)local_60 - 1].scalar == ppVar11[uVar17 - 1].scalar) {
          uVar9 = (uint32_t)local_60;
        }
        local_60._0_4_ = uVar9;
        uVar17 = uVar17 + 1;
      } while (uVar17 <= uVar12);
    }
    local_68 = ppVar11[(uint32_t)local_60 - 1].scalar;
  }
  else {
    local_60 = 1;
    local_68 = 3.4028235e+38;
    pwVar18 = pwVar3;
    do {
      uVar12 = pwVar18->class_index;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * (uVar12 - 1));
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)((uVar12 - 1) * *(int *)(base + 0xe0));
      fVar20 = ec->partial_prediction;
      pwVar18->partial_prediction = fVar20;
      if (fVar20 < local_68) {
LAB_002524e2:
        local_60 = (ulong)uVar12;
        local_68 = fVar20;
      }
      else if (((fVar20 == local_68) && (!NAN(fVar20) && !NAN(local_68))) &&
              (bVar6 = uVar12 < (uint32_t)local_60, bVar6)) goto LAB_002524e2;
      if (ec->passthrough != (features *)0x0) {
        features::push_back(ec->passthrough,fVar20,(ulong)uVar12 ^ 0x398d9fda640553);
      }
      pwVar18 = pwVar18 + 1;
    } while (pwVar18 != pwVar4);
  }
  ec->partial_prediction = local_68;
  pfVar16 = ec->passthrough;
  if (pfVar16 == (features *)0x0) goto LAB_00252762;
  pfVar5 = (pfVar16->values)._begin;
  lVar14 = (long)(pfVar16->values)._end - (long)pfVar5 >> 2;
  if (lVar14 == lVar15) {
LAB_00252744:
    i = 0x398d9fd8715547;
  }
  else {
    fVar20 = 3.4028235e+38;
    uVar19 = 0;
    do {
      fVar2 = pfVar5[lVar15];
      if ((local_68 < fVar2) && (fVar2 < fVar20)) {
        uVar19 = (pfVar16->indicies)._begin[lVar15];
        fVar20 = fVar2;
      }
      lVar15 = lVar15 + 1;
    } while (lVar14 != lVar15);
    if (3.4028235e+38 <= fVar20) goto LAB_00252744;
    features::push_back(pfVar16,fVar20 - local_68,0x398d9fdb078feb);
    pfVar16 = ec->passthrough;
    if (pfVar16 == (features *)0x0) goto LAB_00252762;
    i = uVar19 + 0x1638ab9 ^ 0x398d9fda640553;
  }
  features::push_back(pfVar16,1.0,i);
LAB_00252762:
  (ec->pred).multiclass = (uint32_t)local_60;
  (ec->l).cs.costs._begin = pwVar3;
  (ec->l).cs.costs._end = pwVar4;
  (ec->l).cs.costs.end_array = pwVar7;
  (ec->l).cs.costs.erase_count = sVar8;
  return;
}

Assistant:

void predict_or_learn(csoaa& c, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;
  uint32_t prediction = 1;
  float score = FLT_MAX;
  size_t pt_start = ec.passthrough ? ec.passthrough->size() : 0;
  ec.l.simple = {0., 0., 0.};
  if (ld.costs.size() > 0)
  {
    for (auto& cl : ld.costs)
      inner_loop<is_learn>(base, ec, cl.class_index, cl.x, prediction, score, cl.partial_prediction);
    ec.partial_prediction = score;
  }
  else if (DO_MULTIPREDICT && !is_learn)
  {
    ec.l.simple = {FLT_MAX, 0.f, 0.f};
    base.multipredict(ec, 0, c.num_classes, c.pred, false);
    for (uint32_t i = 1; i <= c.num_classes; i++)
    {
      add_passthrough_feature(ec, i, c.pred[i - 1].scalar);
      if (c.pred[i - 1].scalar < c.pred[prediction - 1].scalar)
        prediction = i;
    }
    ec.partial_prediction = c.pred[prediction - 1].scalar;
  }
  else
  {
    float temp;
    for (uint32_t i = 1; i <= c.num_classes; i++) inner_loop<false>(base, ec, i, FLT_MAX, prediction, score, temp);
  }
  if (ec.passthrough)
  {
    uint64_t second_best = 0;
    float second_best_cost = FLT_MAX;
    for (size_t i = 0; i < ec.passthrough->size() - pt_start; i++)
    {
      float val = ec.passthrough->values[pt_start + i];
      if ((val > ec.partial_prediction) && (val < second_best_cost))
      {
        second_best_cost = val;
        second_best = ec.passthrough->indicies[pt_start + i];
      }
    }
    if (second_best_cost < FLT_MAX)
    {
      float margin = second_best_cost - ec.partial_prediction;
      add_passthrough_feature(ec, constant * 2, margin);
      add_passthrough_feature(ec, constant * 2 + 1 + second_best, 1.);
    }
    else
      add_passthrough_feature(ec, constant * 3, 1.);
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}